

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O0

token * __thiscall
argo::pointer::translate_jsonp_token
          (token *__return_storage_ptr__,pointer *this,string *pointer,size_t *start,size_t *end)

{
  size_t sVar1;
  char *pcVar2;
  json_pointer_exception *pjVar3;
  string local_50 [8];
  string translated;
  size_t *end_local;
  size_t *start_local;
  string *pointer_local;
  pointer *this_local;
  
  std::__cxx11::string::string(local_50);
  *start = *start + 1;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pointer);
  if (*pcVar2 != '/') {
    pjVar3 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
    json_pointer_exception::json_pointer_exception
              (pjVar3,syntax_error_in_pointer_string_e,(int)*start + -1);
    __cxa_throw(pjVar3,&json_pointer_exception::typeinfo,
                json_pointer_exception::~json_pointer_exception);
  }
  while( true ) {
    while( true ) {
      if (*end <= *start) {
        make_token(__return_storage_ptr__,this,(string *)local_50);
        std::__cxx11::string::~string(local_50);
        return __return_storage_ptr__;
      }
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pointer);
      if (*pcVar2 == '~') break;
      *start = *start + 1;
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pointer);
      std::__cxx11::string::operator+=(local_50,*pcVar2);
    }
    sVar1 = *start;
    *start = sVar1 + 1;
    if (*end <= sVar1 + 1) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pointer);
    if (*pcVar2 == '0') {
      std::__cxx11::string::operator+=(local_50,'~');
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pointer);
      if (*pcVar2 != '1') {
        pjVar3 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
        json_pointer_exception::json_pointer_exception
                  (pjVar3,syntax_error_in_pointer_string_e,(int)*start + -1);
        __cxa_throw(pjVar3,&json_pointer_exception::typeinfo,
                    json_pointer_exception::~json_pointer_exception);
      }
      std::__cxx11::string::operator+=(local_50,'/');
    }
    *start = *start + 1;
  }
  pjVar3 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
  json_pointer_exception::json_pointer_exception
            (pjVar3,syntax_error_in_pointer_string_e,(int)*start + -1);
  __cxa_throw(pjVar3,&json_pointer_exception::typeinfo,
              json_pointer_exception::~json_pointer_exception);
}

Assistant:

pointer::token pointer::translate_jsonp_token(const string &pointer, size_t &start, size_t &end)
{
    string translated;

    if (pointer[start++] == '/')
    {
        while (start < end)
        {
            if (pointer[start] == '~')
            {
                if (++start < end)
                {
                    if (pointer[start] == '0')
                    {
                        translated += '~';
                    }
                    else if (pointer[start] == '1')
                    {
                        translated += '/';
                    }
                    else
                    {
                        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                    }
                    start++;
                }
                else
                {
                    throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                }
            }
            else
            {
                translated += pointer[start++];
            }
        }

        return make_token(translated);
    }
    else
    {
        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
    }
}